

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void inplace_flip_container(roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,uint16_t lb_end)

{
  ushort uVar1;
  int iVar2;
  run_container_t *c;
  _Bool _Var3;
  array_container_t *paVar4;
  long lVar5;
  int iVar6;
  uint8_t uVar7;
  uint8_t type;
  uint max;
  long lVar8;
  run_container_t *run;
  uint i;
  uint uVar9;
  uint8_t local_39;
  run_container_t *local_38;
  
  iVar6 = x1_arr->size;
  if (((long)iVar6 == 0) || (x1_arr->keys[(long)iVar6 + -1] == hb)) {
    i = iVar6 - 1;
  }
  else {
    if (iVar6 < 1) {
      i = 0xffffffff;
      goto LAB_0011b70e;
    }
    iVar6 = iVar6 + -1;
    uVar9 = 0;
    do {
      i = iVar6 + uVar9 >> 1;
      uVar1 = *(ushort *)((long)x1_arr->keys + (ulong)(iVar6 + uVar9 & 0xfffffffe));
      if (uVar1 < hb) {
        uVar9 = i + 1;
      }
      else {
        if (uVar1 <= hb) goto LAB_0011b547;
        iVar6 = i - 1;
      }
    } while ((int)uVar9 <= iVar6);
    i = ~uVar9;
  }
  if (-1 < (int)i) {
LAB_0011b547:
    local_39 = x1_arr->typecodes[i & 0xffff];
    paVar4 = (array_container_t *)x1_arr->containers[i & 0xffff];
    if (local_39 == '\x04') {
      paVar4 = (array_container_t *)
               shared_container_extract_copy((shared_container_t *)paVar4,&local_39);
    }
    uVar9 = (uint)lb_start;
    iVar6 = lb_end + 1;
    local_38 = (run_container_t *)0x0;
    if (local_39 == '\x03') {
      iVar6 = run_container_negation_range_inplace((run_container_t *)paVar4,uVar9,iVar6,&local_38);
      uVar7 = (uint8_t)iVar6;
      run = local_38;
      type = uVar7;
      if (uVar7 == '\x04') {
        uVar7 = *(uint8_t *)&local_38->runs;
        if (uVar7 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        run = *(run_container_t **)local_38;
        type = '\x04';
      }
    }
    else {
      if (local_39 == '\x02') {
        _Var3 = array_container_negation_range(paVar4,uVar9,iVar6,&local_38);
        array_container_free(paVar4);
      }
      else {
        if (local_39 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x188f,
                        "container_t *container_inot_range(container_t *, uint8_t, uint32_t, uint32_t, uint8_t *)"
                       );
        }
        _Var3 = bitset_container_negation_range_inplace
                          ((bitset_container_t *)paVar4,uVar9,iVar6,&local_38);
      }
      uVar7 = '\x02' - _Var3;
      run = local_38;
      type = uVar7;
    }
    c = local_38;
    if (uVar7 == '\x03') {
      lVar5 = cpuid_Extended_Feature_Enumeration_info(7);
      if ((*(uint *)(lVar5 + 4) & 0x20) == 0) {
        iVar6 = run->n_runs;
        lVar5 = (long)iVar6;
        if (0 < lVar5) {
          lVar8 = 0;
          do {
            iVar6 = iVar6 + (uint)run->runs[lVar8].length;
            lVar8 = lVar8 + 1;
          } while (lVar5 != lVar8);
        }
      }
      else {
        iVar6 = _avx2_run_container_cardinality(run);
      }
    }
    else {
      if ((uVar7 != '\x02') && (uVar7 != '\x01')) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
      }
      iVar6 = run->n_runs;
    }
    if (iVar6 == 0) {
      container_free(c,type);
      ra_remove_at_index(x1_arr,i);
      return;
    }
    if ((int)i < x1_arr->size) {
      x1_arr->containers[i] = c;
      x1_arr->typecodes[i] = type;
      return;
    }
    __assert_fail("i < ra->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1a3a,
                  "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                 );
  }
LAB_0011b70e:
  uVar9 = (uint)lb_start;
  max = lb_end + 1;
  if (uVar9 <= max) {
    iVar6 = lb_end - uVar9;
    if (iVar6 + 2U < 3) {
      paVar4 = array_container_create_range(uVar9,max);
      uVar7 = '\x02';
    }
    else {
      paVar4 = (array_container_t *)run_container_create_given_capacity(1);
      uVar7 = '\x03';
      if (paVar4 == (array_container_t *)0x0) {
        paVar4 = (array_container_t *)0x0;
      }
      else {
        iVar2 = paVar4->cardinality;
        *(uint *)(paVar4->array + (long)iVar2 * 2) = iVar6 * 0x10000 | uVar9;
        paVar4->cardinality = iVar2 + 1;
      }
    }
    ra_insert_new_key_value_at(x1_arr,~i,hb,paVar4,uVar7);
    return;
  }
  __assert_fail("range_end >= range_start",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x1131,"container_t *container_range_of_ones(uint32_t, uint32_t, uint8_t *)");
}

Assistant:

static void inplace_flip_container(roaring_array_t *x1_arr, uint16_t hb,
                                   uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, i, &ctype_in);
        flipped_container = container_inot_range(
            container_to_flip, ctype_in, (uint32_t)lb_start,
            (uint32_t)(lb_end + 1), &ctype_out);
        // if a new container was created, the old one was already freed
        if (container_get_cardinality(flipped_container, ctype_out)) {
            ra_set_container_at_index(x1_arr, i, flipped_container, ctype_out);
        } else {
            container_free(flipped_container, ctype_out);
            ra_remove_at_index(x1_arr, i);
        }

    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(x1_arr, -i - 1, hb, flipped_container,
                                   ctype_out);
    }
}